

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ispring::File::FileList
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *dir_path,string *ext,bool recursive)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pbVar4;
  int iVar5;
  dirent *pdVar6;
  size_t sVar7;
  undefined7 in_register_00000009;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *temp;
  size_type sVar9;
  value_type *__x;
  pointer pcVar10;
  uint uVar11;
  ulong uVar12;
  size_type *psVar13;
  string *__lhs;
  size_type sVar14;
  value_type *pvVar15;
  string str;
  string path_ext;
  string str_exp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allow_ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [32];
  string *local_e8;
  undefined4 local_dc;
  DIR *local_d8;
  string *local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_dc = (undefined4)CONCAT71(in_register_00000009,recursive);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar10 = (dir_path->_M_dataplus)._M_p;
  sVar8 = dir_path->_M_string_length;
  if ((pcVar10[sVar8 - 1] != '/') && (pcVar10[sVar8 - 1] != '\\')) {
    std::__cxx11::string::push_back((char)dir_path);
    pcVar10 = (dir_path->_M_dataplus)._M_p;
    sVar8 = dir_path->_M_string_length;
  }
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)local_c8,pcVar10,pcVar10 + sVar8);
  local_e8 = dir_path;
  std::__cxx11::string::append((char *)local_c8);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = ext;
  if (ext->_M_string_length != 0) {
    uVar12 = 0;
    do {
      std::__cxx11::string::find((char)ext,0x3b);
      std::__cxx11::string::substr((ulong)&local_128,(ulong)ext);
      sVar8 = local_128._M_string_length;
      _Var1._M_p = local_128._M_dataplus._M_p;
      if (local_128._M_string_length == 0) {
        sVar9 = 0;
      }
      else {
        sVar14 = 0;
        do {
          iVar5 = toupper((int)_Var1._M_p[sVar14]);
          _Var1._M_p[sVar14] = (char)iVar5;
          sVar14 = sVar14 + 1;
          sVar9 = local_128._M_string_length;
          ext = local_d0;
        } while (sVar8 != sVar14);
      }
      std::__cxx11::string::rfind((char)&local_128,0x2e);
      std::__cxx11::string::substr((ulong)local_108,(ulong)&local_128);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
      if ((value_type *)local_108._0_8_ != (value_type *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      uVar12 = uVar12 + sVar9 + 1;
    } while (uVar12 < ext->_M_string_length);
  }
  __lhs = local_e8;
  local_d8 = opendir((local_e8->_M_dataplus)._M_p);
  if (local_d8 != (DIR *)0x0) {
    while( true ) {
      pdVar6 = readdir(local_d8);
      if (pdVar6 == (dirent *)0x0) break;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      sVar7 = strlen(pdVar6->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,pdVar6->d_name,pdVar6->d_name + sVar7);
      if (pdVar6->d_type == '\b') {
        std::__cxx11::string::rfind((char)&local_128,0x2e);
        std::__cxx11::string::substr((ulong)local_108,(ulong)&local_128);
        uVar3 = local_108._8_8_;
        uVar2 = local_108._0_8_;
        if ((value_type *)local_108._8_8_ != (value_type *)0x0) {
          pvVar15 = (value_type *)0x0;
          do {
            iVar5 = toupper((int)*(char *)(uVar2 + (long)pvVar15));
            *(char *)(uVar2 + (long)pvVar15) = (char)iVar5;
            pvVar15 = (value_type *)((long)&(pvVar15->_M_dataplus)._M_p + 1);
          } while ((value_type *)uVar3 != pvVar15);
        }
        pbVar4 = local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ext = local_d0;
        uVar3 = local_108._8_8_;
        uVar2 = local_108._0_8_;
        uVar11 = (uint)((ulong)((long)local_a8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if (0 < (int)uVar11) {
          uVar12 = (ulong)(uVar11 & 0x7fffffff);
          psVar13 = &(local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          do {
            if (((value_type *)*psVar13 == (value_type *)uVar3) &&
               (((value_type *)uVar3 == (value_type *)0x0 ||
                (iVar5 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(psVar13 + -1))->_M_dataplus)._M_p,(void *)uVar2,uVar3), iVar5 == 0
                )))) goto LAB_00134641;
            psVar13 = psVar13 + 4;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        iVar5 = std::__cxx11::string::compare((char *)pbVar4);
        if (iVar5 == 0) {
LAB_00134641:
          std::operator+(&local_50,local_e8,&local_128);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        __lhs = local_e8;
        if ((value_type *)local_108._0_8_ != (value_type *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          __lhs = local_e8;
        }
      }
      else if ((((char)local_dc != '\0') &&
               (iVar5 = std::__cxx11::string::compare((char *)&local_128), iVar5 != 0)) &&
              (iVar5 = std::__cxx11::string::compare((char *)&local_128), iVar5 != 0)) {
        std::operator+(&local_70,__lhs,&local_128);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar10 = (ext->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar10,pcVar10 + ext->_M_string_length);
        FileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_108,&local_70,&local_90,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        __x = (value_type *)local_108._0_8_;
        pvVar15 = (value_type *)local_108._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          __x = (value_type *)local_108._0_8_;
          pvVar15 = (value_type *)local_108._8_8_;
        }
        for (; __x != pvVar15; __x = __x + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,__x);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    closedir(local_d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> FileList(std::string dir_path, std::string ext, bool recursive = false) {
			std::vector<std::string> paths; //return value
			if (dir_path.back() != '/' && dir_path.back() != '\\') {
				dir_path.push_back('/');
			}
			std::string str_exp = dir_path + "*.*";
			std::vector<std::string> allow_ext;
			std::string::size_type offset = 0;
			while (offset < ext.length()) {
				std::string str = ext.substr(offset, ext.find(';', offset) - offset);
				std::transform(str.begin(), str.end(), str.begin(), toupper);
				offset += str.length() + 1;
				std::string::size_type pos = str.find_last_of('.');
				pos = pos == std::string::npos ? 0 : pos + 1;
				allow_ext.push_back(str.substr(pos, str.length()));
			}
			DIR* fd=opendir(dir_path.c_str());
			if (fd == NULL) {
				return paths;
			}
			struct dirent* hFind=NULL;
			while(hFind=readdir(fd)){
				std::string path = hFind->d_name;
				if(hFind->d_type==DT_REG) {    //is File?
					std::string path_ext = path.substr(path.find_last_of('.') + 1, path.length());  //파일의 확장자 추출
					std::transform(path_ext.begin(), path_ext.end(), path_ext.begin(), toupper);
					int i = -1;
					while (++i < (int) allow_ext.size() && allow_ext[i] != path_ext);
					if (i < (int) allow_ext.size() || allow_ext.front() == "*") {    //allow_ext에 포함되어있으면
						paths.push_back(dir_path + path);
					}
				}else if (recursive == true && path != "." && path != "..") {	//is Directory?
					std::vector<std::string> temps = FileList(dir_path + path, ext, recursive);
					for (auto&temp : temps) {
						paths.push_back(temp);
					}
				}
			}
			closedir(fd);
			return paths;   //RVO
		}